

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

bool ReadIT(BYTE *ptr,uint size,input_mod *info,bool meta)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  FString local_100;
  FString msg;
  char *str;
  uint ch;
  BYTE b;
  uint nrow;
  BYTE *p;
  uint i;
  uint rows;
  uint len_2;
  DWORD offset_n_2;
  BYTE chnmask [64];
  uint len_1;
  uint len;
  WORD val16;
  uint pos;
  DWORD offset_n_1;
  DWORD offset_n;
  DWORD *offset;
  uint msgend;
  uint msgoffset;
  uint m_nChannels;
  uint l;
  uint n;
  FString local_40;
  FString ver;
  PITFILEHEADER pifh;
  bool meta_local;
  input_mod *info_local;
  uint size_local;
  BYTE *ptr_local;
  
  if ((ptr == (BYTE *)0x0) || (size < 0x100)) {
    ptr_local._7_1_ = false;
  }
  else if ((((*(int *)ptr == 0x4d504d49) && (*(ushort *)(ptr + 0x22) < 0x100)) &&
           (*(short *)(ptr + 0x24) != 0)) &&
          ((*(ushort *)(ptr + 0x24) < 0xfa1 && (*(short *)(ptr + 0x20) != 0)))) {
    if (size < *(ushort *)(ptr + 0x20) + 0xc0 + (uint)*(ushort *)(ptr + 0x22) * 4 +
               (uint)*(ushort *)(ptr + 0x24) * 4 + (uint)*(ushort *)(ptr + 0x26) * 4) {
      ptr_local._7_1_ = false;
    }
    else {
      ver.Chars = (char *)ptr;
      FString::FString(&local_40);
      FString::Format(&local_40,"IT v%u.%02x",(ulong)(*(ushort *)(ver.Chars + 0x2a) >> 8),
                      (ulong)(byte)*(ushort *)(ver.Chars + 0x2a));
      FString::operator=(&info->Codec,&local_40);
      FString::Format(&local_40,"%u.%02x",(ulong)(*(ushort *)(ver.Chars + 0x28) >> 8),
                      (ulong)(byte)*(ushort *)(ver.Chars + 0x28));
      FString::operator=(&info->TrackerVersion,&local_40);
      msgend = 0;
      uVar6 = *(uint *)(ver.Chars + 0x38);
      offset._0_4_ = uVar6 + *(ushort *)(ver.Chars + 0x36);
      if (meta) {
        _offset_n_1 = (uint *)(ptr + (long)(int)((uint)*(ushort *)(ver.Chars + 0x22) << 2) +
                                     (long)(int)(uint)*(ushort *)(ver.Chars + 0x20) + 0xc0);
        m_nChannels = 0;
        for (; m_nChannels < *(ushort *)(ver.Chars + 0x24); m_nChannels = m_nChannels + 1) {
          uVar7 = *_offset_n_1;
          if ((uVar6 <= uVar7) && (uVar7 < (uint)offset)) {
            offset._0_4_ = uVar7;
          }
          _offset_n_1 = _offset_n_1 + 1;
        }
        _offset_n_1 = (uint *)(ptr + (long)(int)(uint)*(ushort *)(ver.Chars + 0x20) + 0xc0);
        m_nChannels = 0;
        for (; m_nChannels < *(ushort *)(ver.Chars + 0x22); m_nChannels = m_nChannels + 1) {
          uVar7 = *_offset_n_1;
          if ((uVar6 <= uVar7) && (uVar7 < (uint)offset)) {
            offset._0_4_ = uVar7;
          }
          _offset_n_1 = _offset_n_1 + 1;
        }
      }
      len = *(ushort *)(ver.Chars + 0x20) + 0xc0 + (uint)*(ushort *)(ver.Chars + 0x22) * 4 +
            (uint)*(ushort *)(ver.Chars + 0x24) * 4 + (uint)*(ushort *)(ver.Chars + 0x26) * 4;
      if (len < size) {
        uVar10 = (ulong)len;
        len = len + 2;
        if (len + (uint)*(ushort *)(ptr + uVar10) * 8 < size) {
          len = (uint)*(ushort *)(ptr + uVar10) * 8 + len;
        }
      }
      if (((*(ushort *)(ver.Chars + 0x2c) & 0x80) != 0) && (len + 0x1320 < size)) {
        len = len + 0x1320;
      }
      if ((len + 8 < size) && (*(int *)(ptr + len) == 0x4d414e50)) {
        uVar7 = *(uint *)(ptr + (ulong)len + 4);
        len = len + 8;
        if ((len + uVar7 <= size) && ((uVar7 < 0x1e01 && (0x1f < uVar7)))) {
          if (meta) {
            for (m_nChannels = 0; m_nChannels < uVar7 >> 5; m_nChannels = m_nChannels + 1) {
            }
          }
          len = uVar7 + len;
        }
      }
      if (((((len + 8 < size) && (*(int *)(ptr + len) == 0x4d414e43)) &&
           (uVar7 = *(uint *)(ptr + (ulong)len + 4), len + 8 + uVar7 <= size)) &&
          ((uVar7 < 0x501 && (0x13 < uVar7)))) && (msgend = uVar7 / 0x14, meta)) {
        for (m_nChannels = 0; m_nChannels < msgend; m_nChannels = m_nChannels + 1) {
        }
      }
      uVar2 = *(ushort *)(ver.Chars + 0x20);
      uVar3 = *(ushort *)(ver.Chars + 0x22);
      uVar4 = *(ushort *)(ver.Chars + 0x24);
      m_nChannels = 0;
      uVar5 = *(ushort *)(ver.Chars + 0x26);
      for (; m_nChannels < uVar5; m_nChannels = m_nChannels + 1) {
        memset(&len_2,0,0x40);
        uVar7 = *(uint *)(ptr + (ulong)m_nChannels * 4 +
                                (long)(int)((uint)uVar4 << 2) +
                                (long)(int)((uint)uVar3 << 2) + (long)(int)(uint)uVar2 + 0xc0);
        if ((uVar7 != 0) && (uVar7 + 4 < size)) {
          uVar8 = (uint)*(ushort *)(ptr + uVar7);
          uVar9 = (uint)*(ushort *)(ptr + (ulong)uVar7 + 2);
          if ((3 < uVar9) && ((uVar9 < 0x101 && (uVar7 + 8 + uVar8 <= size)))) {
            p._0_4_ = 0;
            ch = 0;
            do {
              while( true ) {
                if ((uVar9 <= ch) || (uVar8 <= (uint)p)) goto LAB_0042a06c;
                uVar11 = (uint)p + 1;
                bVar1 = ptr[(ulong)(uint)p + (ulong)uVar7 + 8];
                if (bVar1 != 0) break;
                ch = ch + 1;
                p._0_4_ = uVar11;
              }
              str._4_4_ = bVar1 & 0x7f;
              if ((bVar1 & 0x7f) != 0) {
                str._4_4_ = str._4_4_ - 1 & 0x3f;
              }
              if ((bVar1 & 0x80) != 0) {
                if (uVar8 <= uVar11) break;
                *(BYTE *)((long)&len_2 + (ulong)str._4_4_) = ptr[(ulong)uVar11 + (ulong)uVar7 + 8];
                uVar11 = (uint)p + 2;
              }
              p._0_4_ = uVar11;
              if ((((*(byte *)((long)&len_2 + (ulong)str._4_4_) & 0xf) != 0) &&
                  (msgend <= str._4_4_)) && (str._4_4_ < 0x40)) {
                msgend = str._4_4_ + 1;
              }
              if ((*(byte *)((long)&len_2 + (ulong)str._4_4_) & 1) != 0) {
                p._0_4_ = (uint)p + 1;
              }
              if ((*(byte *)((long)&len_2 + (ulong)str._4_4_) & 2) != 0) {
                p._0_4_ = (uint)p + 1;
              }
              if ((*(byte *)((long)&len_2 + (ulong)str._4_4_) & 4) != 0) {
                p._0_4_ = (uint)p + 1;
              }
              if ((*(byte *)((long)&len_2 + (ulong)str._4_4_) & 8) != 0) {
                p._0_4_ = (uint)p + 2;
              }
            } while ((uint)p < uVar8);
          }
        }
LAB_0042a06c:
      }
      if (((meta) && ((*(ushort *)(ver.Chars + 0x2e) & 1) != 0)) &&
         (((uint)offset != uVar6 && ((uint)offset < size)))) {
        msg.Chars = (char *)(ptr + uVar6);
        FString::FString(&local_100,msg.Chars);
        FString::~FString(&local_100);
      }
      info->NumChannels = msgend;
      info->NumPatterns = (uint)*(ushort *)(ver.Chars + 0x26);
      info->NumOrders = (uint)*(ushort *)(ver.Chars + 0x20);
      ptr_local._7_1_ = true;
      FString::~FString(&local_40);
    }
  }
  else {
    ptr_local._7_1_ = false;
  }
  return ptr_local._7_1_;
}

Assistant:

static bool ReadIT(const BYTE * ptr, unsigned size, input_mod *info, bool meta)
{
	PITFILEHEADER pifh = (PITFILEHEADER) ptr;
	if ((!ptr) || (size < 0x100)) return false;
	if ((LittleLong(pifh->id) != 0x4D504D49) ||
		(LittleShort(pifh->insnum) >= 256) ||
		(!pifh->smpnum) || (LittleShort(pifh->smpnum) > 4000) || // XXX
		(!pifh->ordnum)) return false;
	if (sizeof(ITFILEHEADER) + LittleShort(pifh->ordnum) +
		LittleShort(pifh->insnum)*4 +
		LittleShort(pifh->smpnum)*4 +
		LittleShort(pifh->patnum)*4 > size) return false;

	FString ver;

	ver.Format("IT v%u.%02x", LittleShort(pifh->cmwt) >> 8, LittleShort(pifh->cmwt) & 255);
	info->Codec = ver;

	ver.Format("%u.%02x", LittleShort(pifh->cwtv) >> 8, LittleShort(pifh->cwtv) & 255);
	info->TrackerVersion = ver;

	//if ( pifh->smpnum ) info.info_set_int( field_samples, LittleShort(pifh->smpnum) );
	//if ( pifh->insnum ) info.info_set_int( field_instruments, LittleShort(pifh->insnum) );

	//if ( meta && pifh->songname[0] ) info.meta_add( field_title, string_utf8_from_it( (char*)&pifh->songname, 26 ) );

	unsigned n, l, m_nChannels = 0;

	// bah, some file (jm-romance.it) with message length rounded up to a multiple of 256 (384 instead of 300)
	unsigned msgoffset = LittleLong(pifh->msgoffset);
	unsigned msgend = msgoffset + LittleShort(pifh->msglength);

	DWORD * offset;
//	FString name;
	
	if (meta)
	{
		offset = (DWORD *)(ptr + 0xC0 + LittleShort(pifh->ordnum) + LittleShort(pifh->insnum) * 4);

		for (n = 0, l = LittleShort(pifh->smpnum); n < l; n++, offset++)
		{
			DWORD offset_n = LittleLong( *offset );
			if ( offset_n >= msgoffset && offset_n < msgend ) msgend = offset_n;
			if ((!offset_n) || (offset_n + 0x14 + 26 + 2 >= size)) continue;
			// XXX
			if (ptr[offset_n] == 0 && ptr[offset_n + 1] == 0 &&
				ptr[offset_n + 2] == 'I' && ptr[offset_n + 3] == 'M' &&
				ptr[offset_n + 4] == 'P' && ptr[offset_n + 5] == 'S')
			{
				offset_n += 2;
			}
#if 0
			if (*(ptr + offset_n + 0x14))
			{
				name = "smpl";
				if (n < 10) name << '0';
				name << ('0' + n);
				//info.meta_add(name, string_utf8_from_it((const char *) ptr + offset_n + 0x14, 26));
			}
#endif
		}

		offset = (DWORD *)(ptr + 0xC0 + LittleShort(pifh->ordnum));

		for (n = 0, l = LittleShort(pifh->insnum); n < l; n++, offset++)
		{
			DWORD offset_n = LittleLong( *offset );
			if ( offset_n >= msgoffset && offset_n < msgend ) msgend = offset_n;
			if ((!offset_n) || (offset_n + 0x20 + 26 >= size)) continue;
#if 0
			if (*(ptr + offset_n + 0x20))
			{
				name = "inst";
				if (n < 10) name << '0';
				name << ('0' + n);
				//info.meta_add(name, string_utf8_from_it((const char *) ptr + offset_n + 0x20, 26));
			}
#endif
		}
	}

	unsigned pos = 0xC0 + LittleShort(pifh->ordnum) + LittleShort(pifh->insnum) * 4 + LittleShort(pifh->smpnum) * 4 + LittleShort(pifh->patnum) * 4;

	if (pos < size)
	{
		WORD val16 = LittleShort( *(WORD *)(ptr + pos) );
		pos += 2;
		if (pos + val16 * 8 < size) pos += val16 * 8;
	}

	if (LittleShort(pifh->flags) & 0x80)
	{
		if (pos + sizeof(MODMIDICFG) < size)
		{
			pos += sizeof(MODMIDICFG);
		}
	}

	if ((pos + 8 < size) && (*(DWORD *)(ptr + pos) == MAKE_ID('P','N','A','M')))
	{
		unsigned len = LittleLong(*(DWORD *)(ptr + pos + 4));
		pos += 8;
		if ((pos + len <= size) && (len <= 240 * 32) && (len >= 32))
		{
			if (meta)
			{
				l = len / 32;
				for (n = 0; n < l; n++)
				{
#if 0
					if (*(ptr + pos + n * 32))
					{
						name = "patt";
						if (n < 10) name << '0';
						name << ('0' + n);
						//info.meta_add(name, string_utf8_from_it((const char *) ptr + pos + n * 32, 32));
					}
#endif
				}
			}
			pos += len;
		}
	}

	if ((pos + 8 < size) && (*(DWORD *)(ptr + pos) == MAKE_ID('C','N','A','M')))
	{
		unsigned len = LittleLong(*(DWORD *)(ptr + pos + 4));
		pos += 8;
		if ((pos + len <= size) && (len <= 64 * 20) && (len >= 20))
		{
			l = len / 20;
			m_nChannels = l;
			if (meta)
			{
				for (n = 0; n < l; n++)
				{
#if 0
					if (*(ptr + pos + n * 20))
					{
						name = "chan";
						if (n < 10) name << '0';
						name << ('0' + n);
						//info.meta_add(name, string_utf8_from_it((const char *) ptr + pos + n * 20, 20));
					}
#endif
				}
			}
			pos += len;
		}
	}

	offset = (DWORD *)(ptr + 0xC0 + LittleShort(pifh->ordnum) + LittleShort(pifh->insnum) * 4 + LittleShort(pifh->smpnum) * 4);

	BYTE chnmask[64];

	for (n = 0, l = LittleShort(pifh->patnum); n < l; n++)
	{
		memset(chnmask, 0, sizeof(chnmask));
		DWORD offset_n = LittleLong( offset[n] );
		if ((!offset_n) || (offset_n + 4 >= size)) continue;
		unsigned len = LittleShort(*(WORD *)(ptr + offset_n));
		unsigned rows = LittleShort(*(WORD *)(ptr + offset_n + 2));
		if ((rows < 4) || (rows > 256)) continue;
		if (offset_n + 8 + len > size) continue;
		unsigned i = 0;
		const BYTE * p = ptr + offset_n + 8;
		unsigned nrow = 0;
		while (nrow < rows)
		{
			if (i >= len) break;
			BYTE b = p[i++];
			if (!b)
			{
				nrow++;
				continue;
			}
			unsigned ch = b & 0x7F;
			if (ch) ch = (ch - 1) & 0x3F;
			if (b & 0x80)
			{
				if (i >= len) break;
				chnmask[ch] = p[i++];
			}
			// Channel used
			if (chnmask[ch] & 0x0F)
			{
				if ((ch >= m_nChannels) && (ch < 64)) m_nChannels = ch+1;
			}
			// Note
			if (chnmask[ch] & 1) i++;
			// Instrument
			if (chnmask[ch] & 2) i++;
			// Volume
			if (chnmask[ch] & 4) i++;
			// Effect
			if (chnmask[ch] & 8) i += 2;
			if (i >= len) break;
		}
	}

	if ( meta && ( LittleShort(pifh->special) & 1 ) && ( msgend - msgoffset ) && ( msgend < size ) )
	{
		const char * str = (const char *) ptr + msgoffset;
		FString msg(str);
		//info.meta_add( field_comment, string_utf8_from_it_multiline( msg ) );
	}

	info->NumChannels = m_nChannels;
	info->NumPatterns = LittleShort(pifh->patnum);
	info->NumOrders = LittleShort(pifh->ordnum);

	return true;
}